

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O3

ByteData256 * __thiscall
cfd::core::TapBranch::GetBranchHash
          (ByteData256 *__return_storage_ptr__,TapBranch *this,uint8_t depth)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  HashUtil *pHVar4;
  undefined7 in_register_00000011;
  byte bVar5;
  pointer this_00;
  HashUtil hasher;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  ByteData tapbranch_base;
  ByteData256 local_e8;
  undefined4 local_cc;
  undefined1 local_c8 [40];
  undefined1 local_a0 [16];
  pointer local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_60;
  ByteData local_48;
  
  local_cc = (undefined4)CONCAT71(in_register_00000011,depth);
  GetBaseHash(__return_storage_ptr__,this);
  if ((this->branch_list_).
      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->branch_list_).
      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (GetBranchHash(unsigned_char)::kTaggedHash == '\0') {
      iVar3 = __cxa_guard_acquire(&GetBranchHash(unsigned_char)::kTaggedHash);
      if (iVar3 != 0) {
        local_c8._0_8_ = local_c8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"TapBranch","");
        HashUtil::Sha256(&GetBranchHash::kTaggedHash,(string *)local_c8);
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_);
        }
        __cxa_atexit(ByteData256::~ByteData256,&GetBranchHash::kTaggedHash,&__dso_handle);
        __cxa_guard_release(&GetBranchHash(unsigned_char)::kTaggedHash);
      }
    }
    ByteData256::Concat<cfd::core::ByteData256>
              (&local_48,&GetBranchHash::kTaggedHash,&GetBranchHash::kTaggedHash);
    (*this->_vptr_TapBranch[4])(&local_60,this);
    if (local_60.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_60.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = local_60.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar5 = 1;
      do {
        HashUtil::HashUtil((HashUtil *)local_a0,'\x03');
        pHVar4 = HashUtil::operator<<((HashUtil *)local_a0,&local_48);
        HashUtil::HashUtil((HashUtil *)local_c8,pHVar4);
        local_a0._0_8_ = &PTR__HashUtil_0072e668;
        if (local_90 != (pointer)0x0) {
          operator_delete(local_90);
        }
        ByteData256::GetBytes
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,this_00);
        ByteData256::GetBytes(&local_78,__return_storage_ptr__);
        bVar2 = ::std::__lexicographical_compare<true>::__lc<unsigned_char,unsigned_char>
                          (local_78.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           local_78.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish,(uchar *)local_a0._0_8_,
                           (uchar *)local_a0._8_8_);
        if (bVar2) {
          pHVar4 = HashUtil::operator<<((HashUtil *)local_c8,__return_storage_ptr__);
          pHVar4 = HashUtil::operator<<(pHVar4,this_00);
          HashUtil::Output256(&local_e8,pHVar4);
        }
        else {
          pHVar4 = HashUtil::operator<<((HashUtil *)local_c8,this_00);
          pHVar4 = HashUtil::operator<<(pHVar4,__return_storage_ptr__);
          HashUtil::Output256(&local_e8,pHVar4);
        }
        puVar1 = (__return_storage_ptr__->data_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (__return_storage_ptr__->data_).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->data_).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->data_).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar1 != (pointer)0x0) {
          operator_delete(puVar1);
          if (local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e8.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((_func_int **)local_a0._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_a0._0_8_);
        }
        local_c8._0_8_ = &PTR__HashUtil_0072e668;
        if ((pointer)local_c8._16_8_ != (pointer)0x0) {
          operator_delete((void *)local_c8._16_8_);
        }
        this_00 = this_00 + 1;
      } while ((this_00 !=
                local_60.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_finish) &&
              (bVar2 = bVar5 <= (byte)local_cc, bVar5 = bVar5 + 1, bVar2));
    }
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_60);
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 TapBranch::GetBranchHash(uint8_t depth) const {
  ByteData256 hash = GetBaseHash();
  if (branch_list_.empty()) return hash;

  static auto kTaggedHash = HashUtil::Sha256("TapBranch");
  ByteData tapbranch_base = kTaggedHash.Concat(kTaggedHash);
  auto nodes = GetNodeList();
  uint8_t index = 0;
  for (const auto& node : nodes) {
    if (index > depth) break;
    auto hasher = HashUtil(HashUtil::kSha256) << tapbranch_base;
    const auto& node_bytes = node.GetBytes();
    const auto& hash_bytes = hash.GetBytes();
    if (std::lexicographical_compare(
            hash_bytes.begin(), hash_bytes.end(), node_bytes.begin(),
            node_bytes.end())) {
      hash = (hasher << hash << node).Output256();
    } else {
      hash = (hasher << node << hash).Output256();
    }
    ++index;
  }
  return hash;
}